

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O1

Cookie * Curl_cookie_add(Curl_easy *data,CookieInfo *c,_Bool httpheader,char *lineptr,char *domain,
                        char *path)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  Cookie **ppCVar4;
  _Bool _Var5;
  int iVar6;
  int iVar7;
  time_t tVar8;
  Cookie *pCVar9;
  char *pcVar10;
  char *pcVar11;
  size_t sVar12;
  size_t sVar13;
  char *pcVar14;
  long lVar15;
  time_t tVar16;
  char *pcVar17;
  Cookie *pCVar18;
  Cookie *pCVar19;
  uint uVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  byte bVar24;
  Cookie *local_480;
  char *local_478;
  in_addr addr;
  char name [1024];
  
  bVar24 = 0;
  tVar8 = time((time_t *)0x0);
  pCVar9 = (Cookie *)(*Curl_ccalloc)(1,0x60);
  if (pCVar9 == (Cookie *)0x0) {
    return (Cookie *)0x0;
  }
  if (httpheader) {
    pcVar10 = (char *)(*Curl_cmalloc)(5000);
    if (pcVar10 == (char *)0x0) {
LAB_0050d888:
      (*Curl_cfree)(pCVar9);
      return (Cookie *)0x0;
    }
    pcVar11 = strchr(lineptr,0x3b);
    for (; (*lineptr == '\t' || (*lineptr == ' ')); lineptr = lineptr + 1) {
    }
    bVar22 = false;
    local_478 = domain;
    do {
      *pcVar10 = '\0';
      name._0_8_ = name._0_8_ & 0xffffffffffffff00;
      iVar6 = __isoc99_sscanf(lineptr,"%1023[^;\r\n=] =%4999[^;\r\n]",name,pcVar10);
      if (0 < iVar6) {
        sVar12 = strlen(pcVar10);
        sVar13 = strlen(name);
        cVar1 = lineptr[sVar13];
        if ((sVar13 != 0) && ((lineptr[sVar13 - 1] == ' ' || (lineptr[sVar13 - 1] == '\t')))) {
          for (; ((cVar2 = lineptr[sVar13 - 1], cVar2 == ' ' || ((cVar2 != '\0' && (cVar2 == '\t')))
                  ) && (sVar13 != 0)); sVar13 = sVar13 - 1) {
          }
          name[sVar13] = '\0';
        }
        for (; (pcVar17 = pcVar10, sVar12 != 0 &&
               ((pcVar10[sVar12 - 1] == ' ' || (pcVar10[sVar12 - 1] == '\t')))); sVar12 = sVar12 - 1
            ) {
          pcVar10[sVar12 - 1] = '\0';
        }
        for (; (*pcVar17 == ' ' || (*pcVar17 == '\t')); pcVar17 = pcVar17 + 1) {
        }
        if ((pCVar9->name == (char *)0x0) && (cVar1 == '=')) {
          pcVar14 = (*Curl_cstrdup)(name);
          pCVar9->name = pcVar14;
          pcVar14 = (*Curl_cstrdup)(pcVar17);
          pCVar9->value = pcVar14;
          if (pcVar14 != (char *)0x0 && pCVar9->name != (char *)0x0) {
LAB_0050da04:
            iVar6 = Curl_strcasecompare("path",name);
            if (iVar6 == 0) {
              iVar6 = Curl_strcasecompare("domain",name);
              if (iVar6 != 0) {
                pcVar17 = pcVar17 + (*pcVar17 == '.');
                pcVar14 = strchr(pcVar17,0x2e);
                if ((pcVar14 == (char *)0x0) &&
                   (iVar6 = Curl_strcasecompare("localhost",pcVar17), iVar6 == 0)) {
                  local_478 = ":";
                }
                pcVar14 = local_478;
                if (local_478 == (char *)0x0) {
                  pcVar14 = pcVar17;
                }
                iVar6 = inet_pton(2,pcVar14,&addr);
                if (local_478 == (char *)0x0) {
LAB_0050db7d:
                  (*Curl_cfree)(pCVar9->domain);
                  pcVar17 = (*Curl_cstrdup)(pcVar17);
                  bVar21 = pcVar17 == (char *)0x0;
                  pCVar9->domain = pcVar17;
                  bVar23 = pcVar17 != (char *)0x0;
                  if (bVar23) {
                    if (iVar6 == 0) {
                      pCVar9->tailmatch = true;
                      bVar21 = false;
                      bVar23 = true;
                    }
                  }
                  else {
                    bVar22 = true;
                  }
                }
                else {
                  if (iVar6 == 0) {
                    _Var5 = tailmatch(pcVar17,local_478);
                    if (_Var5) goto LAB_0050db7d;
                  }
                  else {
                    iVar7 = strcmp(pcVar17,local_478);
                    if (iVar7 == 0) goto LAB_0050db7d;
                  }
                  bVar21 = false;
                  Curl_infof(data,"skipped cookie with bad tailmatch domain: %s\n",pcVar17);
                  bVar22 = true;
                  bVar23 = true;
                }
                bVar23 = !bVar23;
                bVar3 = bVar22;
                goto LAB_0050dbd8;
              }
              iVar6 = Curl_strcasecompare("version",name);
              if (iVar6 == 0) {
                iVar6 = Curl_strcasecompare("max-age",name);
                if (iVar6 == 0) {
                  iVar6 = Curl_strcasecompare("expires",name);
                  if (iVar6 == 0) goto LAB_0050dc51;
                  (*Curl_cfree)(pCVar9->expirestr);
                  pcVar17 = (*Curl_cstrdup)(pcVar17);
                  pCVar9->expirestr = pcVar17;
                }
                else {
                  (*Curl_cfree)(pCVar9->maxage);
                  pcVar17 = (*Curl_cstrdup)(pcVar17);
                  pCVar9->maxage = pcVar17;
                }
              }
              else {
                (*Curl_cfree)(pCVar9->version);
                pcVar17 = (*Curl_cstrdup)(pcVar17);
                pCVar9->version = pcVar17;
              }
              if (pcVar17 != (char *)0x0) goto LAB_0050dc51;
            }
            else {
              (*Curl_cfree)(pCVar9->path);
              pcVar17 = (*Curl_cstrdup)(pcVar17);
              pCVar9->path = pcVar17;
              bVar21 = true;
              if (pcVar17 != (char *)0x0) {
                pcVar17 = sanitize_cookie_path(pcVar17);
                pCVar9->spath = pcVar17;
                bVar23 = pcVar17 == (char *)0x0;
                bVar3 = true;
LAB_0050dbd8:
                if (!bVar23) goto LAB_0050dc51;
                goto LAB_0050dc56;
              }
            }
          }
          bVar21 = true;
          bVar3 = true;
        }
        else {
          if (sVar12 != 0) goto LAB_0050da04;
          iVar6 = Curl_strcasecompare("secure",name);
          if (iVar6 == 0) {
            iVar6 = Curl_strcasecompare("httponly",name);
            if (iVar6 == 0) {
              if (cVar1 == '=') goto LAB_0050da04;
            }
            else {
              pCVar9->httponly = true;
            }
          }
          else {
            pCVar9->secure = true;
          }
LAB_0050dc51:
          bVar21 = false;
          bVar3 = bVar22;
        }
LAB_0050dc56:
        bVar22 = bVar3;
        if (bVar21) break;
      }
      if ((pcVar11 == (char *)0x0) || (*pcVar11 == '\0')) {
LAB_0050dc6c:
        pcVar11 = (char *)0x0;
      }
      else {
        do {
          do {
            lineptr = pcVar11 + 1;
            cVar1 = *lineptr;
            pcVar11 = lineptr;
          } while (cVar1 == ' ');
        } while (cVar1 == '\t');
        pcVar11 = strchr(lineptr,0x3b);
        if (pcVar11 == (char *)0x0) {
          if (cVar1 == '\0') goto LAB_0050dc6c;
          sVar12 = strlen(lineptr);
          pcVar11 = lineptr + sVar12;
        }
      }
    } while (pcVar11 != (char *)0x0);
    pcVar11 = pCVar9->maxage;
    if (pcVar11 == (char *)0x0) {
      if (pCVar9->expirestr != (char *)0x0) {
        tVar16 = curl_getdate(pCVar9->expirestr,(time_t *)0x0);
        pCVar9->expires = tVar16;
        if (tVar16 == 0) {
          pCVar9->expires = 1;
        }
        else if (tVar16 < 0) {
          pCVar9->expires = 0;
        }
      }
    }
    else {
      lVar15 = strtol(pcVar11 + (*pcVar11 == '\"'),(char **)0x0,10);
      pCVar9->expires = lVar15;
      if (0x7fffffffffffffff - tVar8 < lVar15) {
        pCVar9->expires = 0x7fffffffffffffff;
      }
      else {
        pCVar9->expires = lVar15 + tVar8;
      }
    }
    bVar23 = bVar22;
    if (((!bVar22) && (pCVar9->domain == (char *)0x0)) && (local_478 != (char *)0x0)) {
      pcVar11 = (*Curl_cstrdup)(local_478);
      pCVar9->domain = pcVar11;
      bVar23 = true;
      if (pcVar11 != (char *)0x0) {
        bVar23 = bVar22;
      }
    }
    if (((!bVar23) && (path != (char *)0x0)) && (pCVar9->path == (char *)0x0)) {
      pcVar11 = strchr(path,0x3f);
      if (pcVar11 == (char *)0x0) {
        pcVar11 = strrchr(path,0x2f);
      }
      else {
        pcVar11 = (char *)Curl_memrchr(path,0x2f,(long)pcVar11 - (long)path);
      }
      if (pcVar11 != (char *)0x0) {
        pcVar17 = (char *)(*Curl_cmalloc)((size_t)(pcVar11 + (2 - (long)path)));
        pCVar9->path = pcVar17;
        if (pcVar17 == (char *)0x0) {
          bVar23 = true;
        }
        else {
          memcpy(pcVar17,path,(size_t)(pcVar11 + (1 - (long)path)));
          pCVar9->path[(long)(pcVar11 + (1 - (long)path))] = '\0';
          pcVar11 = sanitize_cookie_path(pCVar9->path);
          pCVar9->spath = pcVar11;
          bVar23 = pcVar11 == (char *)0x0;
        }
      }
    }
    (*Curl_cfree)(pcVar10);
    if ((bVar23) || (pCVar9->name == (char *)0x0)) goto LAB_0050e18c;
  }
  else {
    name[0] = '\0';
    name[1] = '\0';
    name[2] = '\0';
    name[3] = '\0';
    name[4] = '\0';
    name[5] = '\0';
    name[6] = '\0';
    name[7] = '\0';
    iVar6 = strncmp(lineptr,"#HttpOnly_",10);
    if (iVar6 == 0) {
      lineptr = lineptr + 10;
      pCVar9->httponly = true;
    }
    if (*lineptr == '#') goto LAB_0050d888;
    pcVar10 = strchr(lineptr,0xd);
    if (pcVar10 != (char *)0x0) {
      *pcVar10 = '\0';
    }
    pcVar10 = strchr(lineptr,10);
    if (pcVar10 != (char *)0x0) {
      *pcVar10 = '\0';
    }
    pcVar10 = strtok_r(lineptr,"\t",(char **)name);
    if (pcVar10 == (char *)0x0) {
      bVar22 = false;
      uVar20 = 0;
    }
    else {
      uVar20 = 0;
      bVar22 = false;
      do {
        switch(uVar20) {
        case 0:
          pcVar10 = (*Curl_cstrdup)(pcVar10 + (*pcVar10 == '.'));
          pCVar9->domain = pcVar10;
          if (pcVar10 == (char *)0x0) {
            bVar22 = true;
          }
          uVar20 = 0;
          break;
        case 1:
          iVar6 = Curl_strcasecompare(pcVar10,"TRUE");
          pCVar9->tailmatch = iVar6 != 0;
          uVar20 = 1;
          break;
        case 2:
          iVar6 = strcmp("TRUE",pcVar10);
          if ((iVar6 == 0) || (iVar6 = strcmp("FALSE",pcVar10), iVar6 == 0)) {
            pcVar11 = (*Curl_cstrdup)("/");
            pCVar9->path = pcVar11;
            pcVar17 = (*Curl_cstrdup)("/");
            if (pcVar11 == (char *)0x0) {
              bVar22 = true;
            }
            pCVar9->spath = pcVar17;
            if (pcVar17 == (char *)0x0) {
              bVar22 = true;
            }
            goto switchD_0050dd96_caseD_3;
          }
          pcVar10 = (*Curl_cstrdup)(pcVar10);
          pCVar9->path = pcVar10;
          uVar20 = 2;
          if (pcVar10 == (char *)0x0) {
            bVar22 = true;
          }
          else {
            pcVar10 = sanitize_cookie_path(pcVar10);
            pCVar9->spath = pcVar10;
            if (pcVar10 == (char *)0x0) {
              bVar22 = true;
            }
          }
          break;
        case 3:
switchD_0050dd96_caseD_3:
          iVar6 = Curl_strcasecompare(pcVar10,"TRUE");
          pCVar9->secure = iVar6 != 0;
          uVar20 = 3;
          break;
        case 4:
          lVar15 = strtol(pcVar10,(char **)0x0,10);
          pCVar9->expires = lVar15;
          uVar20 = 4;
          break;
        case 5:
          pcVar10 = (*Curl_cstrdup)(pcVar10);
          pCVar9->name = pcVar10;
          if (pcVar10 == (char *)0x0) {
            bVar22 = true;
          }
          uVar20 = 5;
          break;
        case 6:
          pcVar10 = (*Curl_cstrdup)(pcVar10);
          pCVar9->value = pcVar10;
          if (pcVar10 == (char *)0x0) {
            bVar22 = true;
          }
          uVar20 = 6;
        }
        pcVar10 = strtok_r((char *)0x0,"\t",(char **)name);
        uVar20 = uVar20 + 1;
      } while ((pcVar10 != (char *)0x0) && (!bVar22));
    }
    if (uVar20 == 6) {
      pcVar10 = (*Curl_cstrdup)("");
      pCVar9->value = pcVar10;
      bVar23 = true;
      if (pcVar10 != (char *)0x0) {
        bVar23 = bVar22;
      }
      bVar22 = bVar23;
      uVar20 = pcVar10 == (char *)0x0 ^ 7;
    }
    if ((bVar22) || (uVar20 != 7)) goto LAB_0050e18c;
  }
  if ((c->running != false) || ((c->newsession != true || (pCVar9->expires != 0)))) {
    pCVar9->livecookie = c->running;
    remove_expired(c);
    bVar23 = false;
    bVar22 = false;
    if (c->cookies == (Cookie *)0x0) {
      pCVar19 = (Cookie *)0x0;
      local_480 = pCVar9;
    }
    else {
      pCVar18 = c->cookies;
      do {
        local_480 = pCVar18;
        iVar6 = Curl_strcasecompare(local_480->name,pCVar9->name);
        if (iVar6 != 0) {
          pcVar10 = local_480->domain;
          if (pcVar10 == (char *)0x0) {
LAB_0050e0c8:
            bVar21 = pCVar9->domain == (char *)0x0;
LAB_0050e0cd:
            bVar22 = bVar23;
            if (bVar21) {
              bVar23 = true;
              bVar22 = true;
            }
          }
          else if (pCVar9->domain == (char *)0x0) {
            if (pcVar10 == (char *)0x0) goto LAB_0050e0c8;
          }
          else {
            iVar6 = Curl_strcasecompare(pcVar10,pCVar9->domain);
            if (iVar6 != 0) {
              bVar21 = local_480->tailmatch == pCVar9->tailmatch;
              goto LAB_0050e0cd;
            }
          }
          if (bVar22) {
            pcVar10 = local_480->spath;
            if (pcVar10 == (char *)0x0) {
LAB_0050e0ff:
              if (pCVar9->spath == (char *)0x0) {
                bVar23 = true;
                bVar22 = true;
              }
              else {
LAB_0050e106:
                bVar23 = false;
                bVar22 = false;
              }
            }
            else {
              if (pCVar9->spath == (char *)0x0) {
                if (pcVar10 == (char *)0x0) goto LAB_0050e0ff;
                goto LAB_0050e106;
              }
              iVar6 = Curl_strcasecompare(pcVar10,pCVar9->spath);
              bVar22 = iVar6 != 0;
              bVar23 = bVar22;
            }
          }
          if (bVar22) {
            if ((pCVar9->livecookie != false) || (local_480->livecookie != true)) {
              pCVar9->next = local_480->next;
              (*Curl_cfree)(local_480->name);
              (*Curl_cfree)(local_480->value);
              (*Curl_cfree)(local_480->domain);
              (*Curl_cfree)(local_480->path);
              (*Curl_cfree)(local_480->spath);
              (*Curl_cfree)(local_480->expirestr);
              (*Curl_cfree)(local_480->version);
              (*Curl_cfree)(local_480->maxage);
              pCVar18 = pCVar9;
              pCVar19 = local_480;
              for (lVar15 = 0xc; lVar15 != 0; lVar15 = lVar15 + -1) {
                pCVar19->next = pCVar18->next;
                pCVar18 = (Cookie *)((long)pCVar18 + (ulong)bVar24 * -0x10 + 8);
                pCVar19 = (Cookie *)((long)pCVar19 + (ulong)bVar24 * -0x10 + 8);
              }
              (*Curl_cfree)(pCVar9);
              pCVar9 = local_480;
              do {
                pCVar19 = pCVar9;
                pCVar9 = pCVar19->next;
              } while (pCVar19->next != (Cookie *)0x0);
              break;
            }
            goto LAB_0050e18c;
          }
        }
        ppCVar4 = &local_480->next;
        pCVar18 = *ppCVar4;
        pCVar19 = local_480;
        local_480 = pCVar9;
      } while (*ppCVar4 != (Cookie *)0x0);
    }
    if (c->running == true) {
      pcVar10 = "Added";
      if (bVar22) {
        pcVar10 = "Replaced";
      }
      Curl_infof(data,"%s cookie %s=\"%s\" for domain %s, path %s, expire %ld\n",pcVar10,
                 local_480->name,local_480->value,local_480->domain,local_480->path,
                 local_480->expires);
    }
    if (!bVar22) {
      if (pCVar19 == (Cookie *)0x0) {
        pCVar19 = (Cookie *)c;
      }
      pCVar19->next = local_480;
      c->numcookies = c->numcookies + 1;
      return local_480;
    }
    return local_480;
  }
LAB_0050e18c:
  freecookie(pCVar9);
  return (Cookie *)0x0;
}

Assistant:

struct Cookie *
Curl_cookie_add(struct Curl_easy *data,
                /* The 'data' pointer here may be NULL at times, and thus
                   must only be used very carefully for things that can deal
                   with data being NULL. Such as infof() and similar */

                struct CookieInfo *c,
                bool httpheader, /* TRUE if HTTP header-style line */
                char *lineptr,   /* first character of the line */
                const char *domain, /* default domain */
                const char *path)   /* full path used when this cookie is set,
                                       used to get default path for the cookie
                                       unless set */
{
  struct Cookie *clist;
  char name[MAX_NAME];
  struct Cookie *co;
  struct Cookie *lastc=NULL;
  time_t now = time(NULL);
  bool replace_old = FALSE;
  bool badcookie = FALSE; /* cookies are good by default. mmmmm yummy */

#ifdef USE_LIBPSL
  const psl_ctx_t *psl;
#endif

#ifdef CURL_DISABLE_VERBOSE_STRINGS
  (void)data;
#endif

  /* First, alloc and init a new struct for it */
  co = calloc(1, sizeof(struct Cookie));
  if(!co)
    return NULL; /* bail out if we're this low on memory */

  if(httpheader) {
    /* This line was read off a HTTP-header */
    const char *ptr;
    const char *semiptr;
    char *what;

    what = malloc(MAX_COOKIE_LINE);
    if(!what) {
      free(co);
      return NULL;
    }

    semiptr=strchr(lineptr, ';'); /* first, find a semicolon */

    while(*lineptr && ISBLANK(*lineptr))
      lineptr++;

    ptr = lineptr;
    do {
      /* we have a <what>=<this> pair or a stand-alone word here */
      name[0]=what[0]=0; /* init the buffers */
      if(1 <= sscanf(ptr, "%" MAX_NAME_TXT "[^;\r\n=] =%"
                     MAX_COOKIE_LINE_TXT "[^;\r\n]",
                     name, what)) {
        /* Use strstore() below to properly deal with received cookie
           headers that have the same string property set more than once,
           and then we use the last one. */
        const char *whatptr;
        bool done = FALSE;
        bool sep;
        size_t len=strlen(what);
        size_t nlen = strlen(name);
        const char *endofn = &ptr[ nlen ];

        /* name ends with a '=' ? */
        sep = (*endofn == '=')?TRUE:FALSE;

        if(nlen) {
          endofn--; /* move to the last character */
          if(ISBLANK(*endofn)) {
            /* skip trailing spaces in name */
            while(*endofn && ISBLANK(*endofn) && nlen) {
              endofn--;
              nlen--;
            }
            name[nlen]=0; /* new end of name */
          }
        }

        /* Strip off trailing whitespace from the 'what' */
        while(len && ISBLANK(what[len-1])) {
          what[len-1]=0;
          len--;
        }

        /* Skip leading whitespace from the 'what' */
        whatptr=what;
        while(*whatptr && ISBLANK(*whatptr))
          whatptr++;

        if(!co->name && sep) {
          /* The very first name/value pair is the actual cookie name */
          co->name = strdup(name);
          co->value = strdup(whatptr);
          if(!co->name || !co->value) {
            badcookie = TRUE;
            break;
          }
        }
        else if(!len) {
          /* this was a "<name>=" with no content, and we must allow
             'secure' and 'httponly' specified this weirdly */
          done = TRUE;
          if(strcasecompare("secure", name))
            co->secure = TRUE;
          else if(strcasecompare("httponly", name))
            co->httponly = TRUE;
          else if(sep)
            /* there was a '=' so we're not done parsing this field */
            done = FALSE;
        }
        if(done)
          ;
        else if(strcasecompare("path", name)) {
          strstore(&co->path, whatptr);
          if(!co->path) {
            badcookie = TRUE; /* out of memory bad */
            break;
          }
          co->spath = sanitize_cookie_path(co->path);
          if(!co->spath) {
            badcookie = TRUE; /* out of memory bad */
            break;
          }
        }
        else if(strcasecompare("domain", name)) {
          bool is_ip;

          /* Now, we make sure that our host is within the given domain,
             or the given domain is not valid and thus cannot be set. */

          if('.' == whatptr[0])
            whatptr++; /* ignore preceding dot */

#ifndef USE_LIBPSL
          /*
           * Without PSL we don't know when the incoming cookie is set on a
           * TLD or otherwise "protected" suffix. To reduce risk, we require a
           * dot OR the exact host name being "localhost".
           */
          {
            const char *dotp;
            /* check for more dots */
            dotp = strchr(whatptr, '.');
            if(!dotp && !strcasecompare("localhost", whatptr))
              domain=":";
          }
#endif

          is_ip = isip(domain ? domain : whatptr);

          if(!domain
             || (is_ip && !strcmp(whatptr, domain))
             || (!is_ip && tailmatch(whatptr, domain))) {
            strstore(&co->domain, whatptr);
            if(!co->domain) {
              badcookie = TRUE;
              break;
            }
            if(!is_ip)
              co->tailmatch=TRUE; /* we always do that if the domain name was
                                     given */
          }
          else {
            /* we did not get a tailmatch and then the attempted set domain
               is not a domain to which the current host belongs. Mark as
               bad. */
            badcookie=TRUE;
            infof(data, "skipped cookie with bad tailmatch domain: %s\n",
                  whatptr);
          }
        }
        else if(strcasecompare("version", name)) {
          strstore(&co->version, whatptr);
          if(!co->version) {
            badcookie = TRUE;
            break;
          }
        }
        else if(strcasecompare("max-age", name)) {
          /* Defined in RFC2109:

             Optional.  The Max-Age attribute defines the lifetime of the
             cookie, in seconds.  The delta-seconds value is a decimal non-
             negative integer.  After delta-seconds seconds elapse, the
             client should discard the cookie.  A value of zero means the
             cookie should be discarded immediately.

          */
          strstore(&co->maxage, whatptr);
          if(!co->maxage) {
            badcookie = TRUE;
            break;
          }
        }
        else if(strcasecompare("expires", name)) {
          strstore(&co->expirestr, whatptr);
          if(!co->expirestr) {
            badcookie = TRUE;
            break;
          }
        }
        /*
          else this is the second (or more) name we don't know
          about! */
      }
      else {
        /* this is an "illegal" <what>=<this> pair */
      }

      if(!semiptr || !*semiptr) {
        /* we already know there are no more cookies */
        semiptr = NULL;
        continue;
      }

      ptr=semiptr+1;
      while(*ptr && ISBLANK(*ptr))
        ptr++;
      semiptr=strchr(ptr, ';'); /* now, find the next semicolon */

      if(!semiptr && *ptr)
        /* There are no more semicolons, but there's a final name=value pair
           coming up */
        semiptr=strchr(ptr, '\0');
    } while(semiptr);

    if(co->maxage) {
      co->expires =
        curlx_strtoofft((*co->maxage=='\"')?
                        &co->maxage[1]:&co->maxage[0], NULL, 10);
      if(CURL_OFF_T_MAX - now < co->expires)
        /* avoid overflow */
        co->expires = CURL_OFF_T_MAX;
      else
        co->expires += now;
    }
    else if(co->expirestr) {
      /* Note that if the date couldn't get parsed for whatever reason,
         the cookie will be treated as a session cookie */
      co->expires = curl_getdate(co->expirestr, NULL);

      /* Session cookies have expires set to 0 so if we get that back
         from the date parser let's add a second to make it a
         non-session cookie */
      if(co->expires == 0)
        co->expires = 1;
      else if(co->expires < 0)
        co->expires = 0;
    }

    if(!badcookie && !co->domain) {
      if(domain) {
        /* no domain was given in the header line, set the default */
        co->domain=strdup(domain);
        if(!co->domain)
          badcookie = TRUE;
      }
    }

    if(!badcookie && !co->path && path) {
      /* No path was given in the header line, set the default.
         Note that the passed-in path to this function MAY have a '?' and
         following part that MUST not be stored as part of the path. */
      char *queryp = strchr(path, '?');

      /* queryp is where the interesting part of the path ends, so now we
         want to the find the last */
      char *endslash;
      if(!queryp)
        endslash = strrchr(path, '/');
      else
        endslash = memrchr(path, '/', (size_t)(queryp - path));
      if(endslash) {
        size_t pathlen = (size_t)(endslash-path+1); /* include ending slash */
        co->path=malloc(pathlen+1); /* one extra for the zero byte */
        if(co->path) {
          memcpy(co->path, path, pathlen);
          co->path[pathlen]=0; /* zero terminate */
          co->spath = sanitize_cookie_path(co->path);
          if(!co->spath)
            badcookie = TRUE; /* out of memory bad */
        }
        else
          badcookie = TRUE;
      }
    }

    free(what);

    if(badcookie || !co->name) {
      /* we didn't get a cookie name or a bad one,
         this is an illegal line, bail out */
      freecookie(co);
      return NULL;
    }

  }
  else {
    /* This line is NOT a HTTP header style line, we do offer support for
       reading the odd netscape cookies-file format here */
    char *ptr;
    char *firstptr;
    char *tok_buf=NULL;
    int fields;

    /* IE introduced HTTP-only cookies to prevent XSS attacks. Cookies
       marked with httpOnly after the domain name are not accessible
       from javascripts, but since curl does not operate at javascript
       level, we include them anyway. In Firefox's cookie files, these
       lines are preceded with #HttpOnly_ and then everything is
       as usual, so we skip 10 characters of the line..
    */
    if(strncmp(lineptr, "#HttpOnly_", 10) == 0) {
      lineptr += 10;
      co->httponly = TRUE;
    }

    if(lineptr[0]=='#') {
      /* don't even try the comments */
      free(co);
      return NULL;
    }
    /* strip off the possible end-of-line characters */
    ptr=strchr(lineptr, '\r');
    if(ptr)
      *ptr=0; /* clear it */
    ptr=strchr(lineptr, '\n');
    if(ptr)
      *ptr=0; /* clear it */

    firstptr=strtok_r(lineptr, "\t", &tok_buf); /* tokenize it on the TAB */

    /* Now loop through the fields and init the struct we already have
       allocated */
    for(ptr=firstptr, fields=0; ptr && !badcookie;
        ptr=strtok_r(NULL, "\t", &tok_buf), fields++) {
      switch(fields) {
      case 0:
        if(ptr[0]=='.') /* skip preceding dots */
          ptr++;
        co->domain = strdup(ptr);
        if(!co->domain)
          badcookie = TRUE;
        break;
      case 1:
        /* This field got its explanation on the 23rd of May 2001 by
           Andr�s Garc�a:

           flag: A TRUE/FALSE value indicating if all machines within a given
           domain can access the variable. This value is set automatically by
           the browser, depending on the value you set for the domain.

           As far as I can see, it is set to true when the cookie says
           .domain.com and to false when the domain is complete www.domain.com
        */
        co->tailmatch = strcasecompare(ptr, "TRUE")?TRUE:FALSE;
        break;
      case 2:
        /* It turns out, that sometimes the file format allows the path
           field to remain not filled in, we try to detect this and work
           around it! Andr�s Garc�a made us aware of this... */
        if(strcmp("TRUE", ptr) && strcmp("FALSE", ptr)) {
          /* only if the path doesn't look like a boolean option! */
          co->path = strdup(ptr);
          if(!co->path)
            badcookie = TRUE;
          else {
            co->spath = sanitize_cookie_path(co->path);
            if(!co->spath) {
              badcookie = TRUE; /* out of memory bad */
            }
          }
          break;
        }
        /* this doesn't look like a path, make one up! */
        co->path = strdup("/");
        if(!co->path)
          badcookie = TRUE;
        co->spath = strdup("/");
        if(!co->spath)
          badcookie = TRUE;
        fields++; /* add a field and fall down to secure */
        /* FALLTHROUGH */
      case 3:
        co->secure = strcasecompare(ptr, "TRUE")?TRUE:FALSE;
        break;
      case 4:
        co->expires = curlx_strtoofft(ptr, NULL, 10);
        break;
      case 5:
        co->name = strdup(ptr);
        if(!co->name)
          badcookie = TRUE;
        break;
      case 6:
        co->value = strdup(ptr);
        if(!co->value)
          badcookie = TRUE;
        break;
      }
    }
    if(6 == fields) {
      /* we got a cookie with blank contents, fix it */
      co->value = strdup("");
      if(!co->value)
        badcookie = TRUE;
      else
        fields++;
    }

    if(!badcookie && (7 != fields))
      /* we did not find the sufficient number of fields */
      badcookie = TRUE;

    if(badcookie) {
      freecookie(co);
      return NULL;
    }

  }

  if(!c->running &&    /* read from a file */
     c->newsession &&  /* clean session cookies */
     !co->expires) {   /* this is a session cookie since it doesn't expire! */
    freecookie(co);
    return NULL;
  }

  co->livecookie = c->running;

  /* now, we have parsed the incoming line, we must now check if this
     superceeds an already existing cookie, which it may if the previous have
     the same domain and path as this */

  /* at first, remove expired cookies */
  remove_expired(c);

#ifdef USE_LIBPSL
  /* Check if the domain is a Public Suffix and if yes, ignore the cookie.
     This needs a libpsl compiled with builtin data. */
  if(domain && co->domain && !isip(co->domain)) {
    psl = psl_builtin();
    if(psl && !psl_is_cookie_domain_acceptable(psl, domain, co->domain)) {
      infof(data,
            "cookie '%s' dropped, domain '%s' must not set cookies for '%s'\n",
            co->name, domain, co->domain);
      freecookie(co);
      return NULL;
    }
  }
#endif

  clist = c->cookies;
  replace_old = FALSE;
  while(clist) {
    if(strcasecompare(clist->name, co->name)) {
      /* the names are identical */

      if(clist->domain && co->domain) {
        if(strcasecompare(clist->domain, co->domain) &&
          (clist->tailmatch == co->tailmatch))
          /* The domains are identical */
          replace_old=TRUE;
      }
      else if(!clist->domain && !co->domain)
        replace_old = TRUE;

      if(replace_old) {
        /* the domains were identical */

        if(clist->spath && co->spath) {
          if(strcasecompare(clist->spath, co->spath)) {
            replace_old = TRUE;
          }
          else
            replace_old = FALSE;
        }
        else if(!clist->spath && !co->spath)
          replace_old = TRUE;
        else
          replace_old = FALSE;

      }

      if(replace_old && !co->livecookie && clist->livecookie) {
        /* Both cookies matched fine, except that the already present
           cookie is "live", which means it was set from a header, while
           the new one isn't "live" and thus only read from a file. We let
           live cookies stay alive */

        /* Free the newcomer and get out of here! */
        freecookie(co);
        return NULL;
      }

      if(replace_old) {
        co->next = clist->next; /* get the next-pointer first */

        /* then free all the old pointers */
        free(clist->name);
        free(clist->value);
        free(clist->domain);
        free(clist->path);
        free(clist->spath);
        free(clist->expirestr);
        free(clist->version);
        free(clist->maxage);

        *clist = *co;  /* then store all the new data */

        free(co);   /* free the newly alloced memory */
        co = clist; /* point to the previous struct instead */

        /* We have replaced a cookie, now skip the rest of the list but
           make sure the 'lastc' pointer is properly set */
        do {
          lastc = clist;
          clist = clist->next;
        } while(clist);
        break;
      }
    }
    lastc = clist;
    clist = clist->next;
  }

  if(c->running)
    /* Only show this when NOT reading the cookies from a file */
    infof(data, "%s cookie %s=\"%s\" for domain %s, path %s, "
          "expire %" CURL_FORMAT_CURL_OFF_T "\n",
          replace_old?"Replaced":"Added", co->name, co->value,
          co->domain, co->path, co->expires);

  if(!replace_old) {
    /* then make the last item point on this new one */
    if(lastc)
      lastc->next = co;
    else
      c->cookies = co;
    c->numcookies++; /* one more cookie in the jar */
  }

  return co;
}